

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O1

array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
* detail::operator|(array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
                    *__return_storage_ptr__,b_str<char32_t> *str,
                   split_helper_subroutine<detail::split_at_first,_char32_t,_char32_t> *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar2;
  char32_t cVar3;
  ulong uVar4;
  char32_t *pcVar5;
  pointer pcVar6;
  undefined8 uVar7;
  long lVar8;
  size_type __pos;
  char32_t *pcVar9;
  ulong uVar10;
  ulong uVar11;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_40;
  
  cVar3 = info->delim;
  uVar4 = str->_M_string_length;
  if (uVar4 == 0) {
    uVar11 = 0xffffffffffffffff;
  }
  else {
    pcVar5 = (str->_M_dataplus)._M_p;
    pcVar9 = pcVar5;
    uVar11 = uVar4;
    do {
      if (*pcVar9 == cVar3) goto LAB_001b66d6;
      pcVar9 = pcVar9 + 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    pcVar9 = (char32_t *)0x0;
LAB_001b66d6:
    uVar11 = -(ulong)(pcVar9 == (char32_t *)0x0) | (long)pcVar9 - (long)pcVar5 >> 2;
  }
  if (uVar11 == 0xffffffffffffffff) {
    paVar1 = &__return_storage_ptr__->_M_elems[0].field_2;
    __return_storage_ptr__->_M_elems[0]._M_dataplus._M_p = (pointer)paVar1;
    pcVar6 = (str->_M_dataplus)._M_p;
    paVar2 = &str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)pcVar6 == paVar2) {
      uVar7 = *(undefined8 *)((long)&str->field_2 + 8);
      paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->_M_elems[0].field_2 + 8) = uVar7;
    }
    else {
      __return_storage_ptr__->_M_elems[0]._M_dataplus._M_p = pcVar6;
      __return_storage_ptr__->_M_elems[0].field_2._M_allocated_capacity =
           paVar2->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_elems[0]._M_string_length = uVar4;
    (str->_M_dataplus)._M_p = (pointer)paVar2;
    str->_M_string_length = 0;
    (str->field_2)._M_local_buf[0] = L'\0';
    __return_storage_ptr__->_M_elems[1]._M_dataplus._M_p =
         (pointer)&__return_storage_ptr__->_M_elems[1].field_2;
    __return_storage_ptr__->_M_elems[1]._M_string_length = 0;
    __return_storage_ptr__->_M_elems[1].field_2._M_local_buf[0] = L'\0';
  }
  else {
    lVar8 = 0x10;
    do {
      *(long *)((long)__return_storage_ptr__->_M_elems + lVar8 + -0x10) =
           (long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar8;
      *(undefined8 *)((long)__return_storage_ptr__->_M_elems + lVar8 + -8) = 0;
      *(undefined4 *)((long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar8) = 0;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x50);
    __pos = 0xffffffffffffffff;
    if (uVar11 < uVar4) {
      uVar10 = uVar11;
      do {
        __pos = uVar10;
        if ((str->_M_dataplus)._M_p[uVar10] != cVar3) break;
        uVar10 = uVar10 + 1;
        __pos = 0xffffffffffffffff;
      } while (uVar4 != uVar10);
    }
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    substr(&local_40,str,__pos,0xffffffffffffffff);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator=(__return_storage_ptr__->_M_elems + 1,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
    }
    if (str->_M_string_length < uVar11) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar11);
    }
    str->_M_string_length = uVar11;
    (str->_M_dataplus)._M_p[uVar11] = L'\0';
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator=(__return_storage_ptr__->_M_elems,str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<b_str<CharType>, 2> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return{ { std::move(str),{} } };
		std::array<b_str<CharType>, 2> re;
		re[1] = str.substr(str.find_first_not_of(info.delim, pos));
		str.erase(pos);
		re[0] = std::move(str);
		return re;
	}